

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedjsoniterator.cpp
# Opt level: O0

bool __thiscall ParsedJson::iterator::prev(iterator *this)

{
  ulong uVar1;
  size_t new_location;
  iterator *this_local;
  bool local_1;
  
  if (this->location - 1 < this->depthindex[this->depth].start_of_scope) {
    local_1 = false;
  }
  else {
    this->location = this->location - 1;
    this->current_val = this->pj->tape[this->location];
    this->current_type = (uint8_t)(this->current_val >> 0x38);
    if ((this->current_type == ']') || (this->current_type == '}')) {
      uVar1 = this->current_val & 0xffffffffffffff;
      if (uVar1 < this->depthindex[this->depth].start_of_scope) {
        return false;
      }
      this->location = uVar1;
      this->current_val = this->pj->tape[this->location];
      this->current_type = (uint8_t)(this->current_val >> 0x38);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ParsedJson::iterator::prev() {
    if(location - 1 < depthindex[depth].start_of_scope) { return false;
}
    location -= 1;
    current_val = pj.tape[location];
    current_type = (current_val >> 56);
    if ((current_type == ']') || (current_type == '}')){
    // we need to jump
    size_t new_location = ( current_val & JSONVALUEMASK);
    if(new_location < depthindex[depth].start_of_scope) {
        return false; // shoud never happen
    }
    location = new_location;
    current_val = pj.tape[location];
    current_type = (current_val >> 56);
    }
    return true;
}